

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

void wprefs(settings_w *sesskey,char *name,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *value;
  long lVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  
  if (nvals < 1) {
    iVar2 = 0;
  }
  else {
    iVar6 = 0;
    iVar2 = 0;
    do {
      iVar1 = conf_get_int_int(conf,primary,iVar6);
      lVar4 = 0;
      do {
        if (*(int *)((long)&mapping->v + lVar4) == iVar1) {
          pcVar7 = *(char **)((long)&mapping->s + lVar4);
          goto LAB_0011785d;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)(uint)nvals * 0x18 != lVar4);
      pcVar7 = (char *)0x0;
LAB_0011785d:
      if (pcVar7 != (char *)0x0) {
        sVar3 = strlen(pcVar7);
        iVar2 = (int)sVar3 + iVar2 + (uint)(0 < iVar2);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != nvals);
  }
  value = (char *)safemalloc((long)(iVar2 + 1),1,0);
  pcVar7 = value;
  if (0 < nvals) {
    iVar6 = 0;
    do {
      iVar1 = conf_get_int_int(conf,primary,iVar6);
      lVar4 = 0;
      do {
        if (*(int *)((long)&mapping->v + lVar4) == iVar1) {
          lVar4 = *(long *)((long)&mapping->s + lVar4);
          goto LAB_001178e2;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)(uint)nvals * 0x18 != lVar4);
      lVar4 = 0;
LAB_001178e2:
      if (lVar4 != 0) {
        pcVar5 = "";
        if (value < pcVar7) {
          pcVar5 = ",";
        }
        iVar1 = sprintf(pcVar7,"%s%s",pcVar5);
        pcVar7 = pcVar7 + iVar1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != nvals);
  }
  if ((long)pcVar7 - (long)value != (long)iVar2) {
    __assert_fail("p - buf == maxlen",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c",
                  0x1d5,
                  "void wprefs(settings_w *, const char *, const struct keyvalwhere *, int, Conf *, int)"
                 );
  }
  *pcVar7 = '\0';
  write_setting_s(sesskey,name,value);
  safefree(value);
  return;
}

Assistant:

static void wprefs(settings_w *sesskey, const char *name,
                   const struct keyvalwhere *mapping, int nvals,
                   Conf *conf, int primary)
{
    char *buf, *p;
    int i, maxlen;

    for (maxlen = i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            maxlen += (maxlen > 0 ? 1 : 0) + strlen(s);
        }
    }

    buf = snewn(maxlen + 1, char);
    p = buf;

    for (i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            p += sprintf(p, "%s%s", (p > buf ? "," : ""), s);
        }
    }

    assert(p - buf == maxlen);
    *p = '\0';

    write_setting_s(sesskey, name, buf);

    sfree(buf);
}